

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::FilmBaseParameters::FilmBaseParameters
          (FilmBaseParameters *this,ParameterDictionary *parameters,FilterHandle *filter,
          PixelSensor *sensor,FileLoc *loc)

{
  bool bVar1;
  ulong uVar2;
  int *piVar3;
  Bounds2<int> *pBVar4;
  size_type sVar5;
  Bounds2<float> *pBVar6;
  reference pvVar7;
  reference pvVar8;
  float *pfVar9;
  undefined8 in_RCX;
  int *in_RDI;
  Float FVar10;
  double dVar11;
  Bounds2f crop_1;
  Bounds2f crop;
  vector<float,_std::allocator<float>_> cr;
  Bounds2i newBounds_1;
  Bounds2i newBounds;
  vector<int,_std::allocator<int>_> pb;
  int in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  ParameterDictionary *in_stack_fffffffffffffb48;
  Bounds2<float> *in_stack_fffffffffffffb50;
  vector<float,_std::allocator<float>_> *pvVar12;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  float in_stack_fffffffffffffb80;
  float in_stack_fffffffffffffb84;
  string *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffb90;
  ParameterDictionary *in_stack_fffffffffffffb98;
  undefined1 local_2b1 [37];
  undefined4 local_28c;
  undefined8 local_278;
  undefined8 local_270;
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  undefined8 local_248;
  undefined8 local_240;
  Tuple2<pbrt::Point2,_float> local_238;
  Tuple2<pbrt::Point2,_float> TStack_230;
  allocator<char> local_219;
  string local_218 [32];
  vector<float,_std::allocator<float>_> local_1f8;
  Bounds2<int> local_1dc;
  Bounds2<int> local_1cc;
  undefined4 local_19c;
  Bounds2<int> local_198;
  Bounds2<int> local_188;
  Tuple2<pbrt::Point2,_int> local_178;
  Tuple2<pbrt::Point2,_int> TStack_170;
  allocator<char> local_161;
  string local_160 [32];
  vector<int,_std::allocator<int>_> local_140;
  undefined8 local_11c;
  undefined8 uStack_114;
  int local_10c [3];
  int local_100;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [36];
  undefined8 local_ac;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [40];
  undefined8 local_20;
  
  local_20 = in_RCX;
  Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  Bounds2<int>::Bounds2((Bounds2<int> *)in_stack_fffffffffffffb50);
  FilterHandle::FilterHandle
            ((FilterHandle *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (FilterHandle *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  *(undefined8 *)(in_RDI + 10) = local_20;
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  ParameterDictionary::GetOneString
            (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xc),local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      Warning<std::__cxx11::string&,std::__cxx11::string&>
                ((FileLoc *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0xc),(string *)(Options + 0x28));
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0xc),"pbrt.exr");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  ParameterDictionary::GetOneInt
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  ParameterDictionary::GetOneInt
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0);
  Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                      in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
  *(undefined8 *)in_RDI = local_ac;
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  if ((*(byte *)(Options + 8) & 1) != 0) {
    local_100 = 1;
    local_10c[2] = *in_RDI;
    if (local_10c[2] < 0) {
      local_10c[2] = local_10c[2] + 3;
    }
    local_10c[2] = local_10c[2] >> 2;
    piVar3 = std::max<int>(&local_100,local_10c + 2);
    *in_RDI = *piVar3;
    local_10c[1] = 1;
    local_10c[0] = in_RDI[1];
    if (local_10c[0] < 0) {
      local_10c[0] = local_10c[0] + 3;
    }
    local_10c[0] = local_10c[0] >> 2;
    piVar3 = std::max<int>(local_10c + 1,local_10c);
    in_RDI[1] = *piVar3;
  }
  Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                      in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
  Bounds2<int>::Bounds2
            ((Bounds2<int> *)in_stack_fffffffffffffb50,(Point2<int> *)in_stack_fffffffffffffb48,
             (Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  *(undefined8 *)(in_RDI + 2) = local_11c;
  *(undefined8 *)(in_RDI + 4) = uStack_114;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  ParameterDictionary::GetIntArray
            (in_stack_fffffffffffffb48,
             (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0xdc));
  if (bVar1) {
    pBVar4 = pstd::optional<pbrt::Bounds2<int>_>::operator*
                       ((optional<pbrt::Bounds2<int>_> *)0x6ad758);
    local_178 = (pBVar4->pMin).super_Tuple2<pbrt::Point2,_int>;
    TStack_170 = (pBVar4->pMax).super_Tuple2<pbrt::Point2,_int>;
    local_188 = Intersect<int>((Bounds2<int> *)in_stack_fffffffffffffb50,
                               (Bounds2<int> *)in_stack_fffffffffffffb48);
    bVar1 = Bounds2<int>::operator!=
                      ((Bounds2<int> *)in_stack_fffffffffffffb50,
                       (Bounds2<int> *)in_stack_fffffffffffffb48);
    if (bVar1) {
      Warning((FileLoc *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
              (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    }
    local_198 = Intersect<int>((Bounds2<int> *)in_stack_fffffffffffffb50,
                               (Bounds2<int> *)in_stack_fffffffffffffb48);
    *(Bounds2<int> *)(in_RDI + 2) = local_198;
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50);
    if (!bVar1) {
      Warning((FileLoc *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
              (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    }
  }
  else {
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50);
    if (!bVar1) {
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_140);
      if (sVar5 == 4) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_140,0);
        std::vector<int,_std::allocator<int>_>::operator[](&local_140,2);
        Point2<int>::Point2((Point2<int> *)
                            CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
        std::vector<int,_std::allocator<int>_>::operator[](&local_140,1);
        std::vector<int,_std::allocator<int>_>::operator[](&local_140,3);
        Point2<int>::Point2((Point2<int> *)
                            CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
        Bounds2<int>::Bounds2
                  ((Bounds2<int> *)in_stack_fffffffffffffb50,
                   (Point2<int> *)in_stack_fffffffffffffb48,
                   (Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        local_1cc = Intersect<int>((Bounds2<int> *)in_stack_fffffffffffffb50,
                                   (Bounds2<int> *)in_stack_fffffffffffffb48);
        bVar1 = Bounds2<int>::operator!=
                          ((Bounds2<int> *)in_stack_fffffffffffffb50,
                           (Bounds2<int> *)in_stack_fffffffffffffb48);
        if (bVar1) {
          Warning((FileLoc *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                  (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        }
        local_1dc = Intersect<int>((Bounds2<int> *)in_stack_fffffffffffffb50,
                                   (Bounds2<int> *)in_stack_fffffffffffffb48);
        *(Bounds2<int> *)(in_RDI + 2) = local_1dc;
      }
      else {
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_140);
        local_19c = (undefined4)sVar5;
        Error<int>((FileLoc *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (int *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  ParameterDictionary::GetFloatArray
            (in_stack_fffffffffffffb48,
             (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 200));
  if (bVar1) {
    pBVar6 = pstd::optional<pbrt::Bounds2<float>_>::operator*
                       ((optional<pbrt::Bounds2<float>_> *)0x6adbe5);
    local_238 = (pBVar6->pMin).super_Tuple2<pbrt::Point2,_float>;
    TStack_230 = (pBVar6->pMax).super_Tuple2<pbrt::Point2,_float>;
    std::ceil((double)(ulong)(uint)((float)*in_RDI * local_238.x));
    std::ceil((double)(ulong)(uint)((float)in_RDI[1] * local_238.y));
    Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                        ,in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
    std::ceil((double)(ulong)(uint)((float)*in_RDI * TStack_230.x));
    std::ceil((double)(ulong)(uint)((float)in_RDI[1] * TStack_230.y));
    Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                        ,in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
    Bounds2<int>::Bounds2
              ((Bounds2<int> *)in_stack_fffffffffffffb50,(Point2<int> *)in_stack_fffffffffffffb48,
               (Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    *(undefined8 *)(in_RDI + 2) = local_248;
    *(undefined8 *)(in_RDI + 4) = local_240;
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb50);
    if (!bVar1) {
      Warning((FileLoc *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
              (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    }
    bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0xdc));
    if (!bVar1) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50);
      if (bVar1) goto LAB_006ae250;
    }
    Warning((FileLoc *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
            (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  }
  else {
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb50);
    if (!bVar1) {
      bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0xdc));
      if (bVar1) {
        Warning((FileLoc *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      }
      else {
        sVar5 = std::vector<float,_std::allocator<float>_>::size(&local_1f8);
        if (sVar5 == 4) {
          bVar1 = std::vector<int,_std::allocator<int>_>::empty
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50);
          if (!bVar1) {
            Warning((FileLoc *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                    (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          }
          Bounds2<float>::Bounds2(in_stack_fffffffffffffb50);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,0);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,1);
          pfVar9 = std::min<float>(pvVar7,pvVar8);
          local_268 = Clamp<float,float,float>(*pfVar9,0.0,1.0);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,0);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,1);
          pfVar9 = std::max<float>(pvVar7,pvVar8);
          local_260 = Clamp<float,float,float>(*pfVar9,0.0,1.0);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,2);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_1f8,3);
          pfVar9 = std::min<float>(pvVar7,pvVar8);
          local_264 = Clamp<float,float,float>(*pfVar9,0.0,1.0);
          pvVar12 = &local_1f8;
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar12,2);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](pvVar12,3);
          pfVar9 = std::max<float>(pvVar7,pvVar8);
          in_stack_fffffffffffffb84 = Clamp<float,float,float>(*pfVar9,0.0,1.0);
          local_25c = in_stack_fffffffffffffb84;
          dVar11 = std::ceil((double)(ulong)(uint)((float)*in_RDI * local_268));
          in_stack_fffffffffffffb80 = SUB84(dVar11,0);
          in_stack_fffffffffffffb78 = (int)in_stack_fffffffffffffb80;
          dVar11 = std::ceil((double)(ulong)(uint)((float)in_RDI[1] * local_264));
          in_stack_fffffffffffffb7c = SUB84(dVar11,0);
          Point2<int>::Point2((Point2<int> *)
                              CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                              in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
          dVar11 = std::ceil((double)(ulong)(uint)((float)*in_RDI * local_260));
          in_stack_fffffffffffffb74 = SUB84(dVar11,0);
          dVar11 = std::ceil((double)(ulong)(uint)((float)in_RDI[1] * local_25c));
          in_stack_fffffffffffffb70 = SUB84(dVar11,0);
          Point2<int>::Point2((Point2<int> *)
                              CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                              in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
          Bounds2<int>::Bounds2
                    ((Bounds2<int> *)in_stack_fffffffffffffb50,
                     (Point2<int> *)in_stack_fffffffffffffb48,
                     (Point2<int> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
          *(undefined8 *)(in_RDI + 2) = local_278;
          *(undefined8 *)(in_RDI + 4) = local_270;
        }
        else {
          sVar5 = std::vector<float,_std::allocator<float>_>::size(&local_1f8);
          local_28c = (undefined4)sVar5;
          Error<int>((FileLoc *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (int *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        }
      }
    }
  }
LAB_006ae250:
  bVar1 = Bounds2<int>::IsEmpty((Bounds2<int> *)(in_RDI + 2));
  if (bVar1) {
    ErrorExit<pbrt::Bounds2<int>&>
              ((FileLoc *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (Bounds2<int> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  }
  pvVar12 = (vector<float,_std::allocator<float>_> *)local_2b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  FVar10 = ParameterDictionary::GetOneFloat
                     ((ParameterDictionary *)
                      CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                      (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0.0);
  in_RDI[8] = (int)FVar10;
  std::__cxx11::string::~string((string *)(local_2b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2b1);
  std::vector<float,_std::allocator<float>_>::~vector(pvVar12);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)pvVar12);
  return;
}

Assistant:

FilmBaseParameters::FilmBaseParameters(const ParameterDictionary &parameters,
                                       FilterHandle filter, const PixelSensor *sensor,
                                       const FileLoc *loc)
    : filter(filter), sensor(sensor) {
    filename = parameters.GetOneString("filename", "");
    if (!Options->imageFile.empty()) {
        if (!filename.empty())
            Warning(loc,
                    "Output filename supplied on command line, \"%s\" will "
                    "override "
                    "filename provided in scene description file, \"%s\".",
                    Options->imageFile, filename);
        filename = Options->imageFile;
    } else if (filename.empty())
        filename = "pbrt.exr";

    fullResolution = Point2i(parameters.GetOneInt("xresolution", 1280),
                             parameters.GetOneInt("yresolution", 720));
    if (Options->quickRender) {
        fullResolution.x = std::max(1, fullResolution.x / 4);
        fullResolution.y = std::max(1, fullResolution.y / 4);
    }

    pixelBounds = Bounds2i(Point2i(0, 0), fullResolution);
    std::vector<int> pb = parameters.GetIntArray("pixelbounds");
    if (Options->pixelBounds) {
        Bounds2i newBounds = *Options->pixelBounds;
        if (Intersect(newBounds, pixelBounds) != newBounds)
            Warning(loc, "Supplied pixel bounds extend beyond image "
                         "resolution. Clamping.");
        pixelBounds = Intersect(newBounds, pixelBounds);

        if (!pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!pb.empty()) {
        if (pb.size() != 4)
            Error(loc, "%d values supplied for \"pixelbounds\". Expected 4.",
                  int(pb.size()));
        else {
            Bounds2i newBounds = Bounds2i({pb[0], pb[2]}, {pb[1], pb[3]});
            if (Intersect(newBounds, pixelBounds) != newBounds)
                Warning(loc, "Supplied pixel bounds extend beyond image "
                             "resolution. Clamping.");
            pixelBounds = Intersect(newBounds, pixelBounds);
        }
    }

    std::vector<Float> cr = parameters.GetFloatArray("cropwindow");
    if (Options->cropWindow) {
        Bounds2f crop = *Options->cropWindow;
        // Compute film image bounds
        pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                       std::ceil(fullResolution.y * crop.pMin.y)),
                               Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                       std::ceil(fullResolution.y * crop.pMax.y)));

        if (!cr.empty())
            Warning(loc, "Crop window supplied on command line will override "
                         "crop window specified with Film.");
        if (Options->pixelBounds || !pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!cr.empty()) {
        if (Options->pixelBounds)
            Warning(loc, "Ignoring \"cropwindow\" since pixel bounds were specified "
                         "on the command line.");
        else if (cr.size() == 4) {
            if (!pb.empty())
                Warning(loc, "Both pixel bounds and crop window were "
                             "specified. Using the "
                             "crop window.");

            Bounds2f crop;
            crop.pMin.x = Clamp(std::min(cr[0], cr[1]), 0.f, 1.f);
            crop.pMax.x = Clamp(std::max(cr[0], cr[1]), 0.f, 1.f);
            crop.pMin.y = Clamp(std::min(cr[2], cr[3]), 0.f, 1.f);
            crop.pMax.y = Clamp(std::max(cr[2], cr[3]), 0.f, 1.f);

            // Compute film image bounds
            pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                           std::ceil(fullResolution.y * crop.pMin.y)),
                                   Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                           std::ceil(fullResolution.y * crop.pMax.y)));
        } else
            Error(loc, "%d values supplied for \"cropwindow\". Expected 4.",
                  (int)cr.size());
    }

    if (pixelBounds.IsEmpty())
        ErrorExit(loc, "Degenerate pixel bounds provided to film: %s.", pixelBounds);

    diagonal = parameters.GetOneFloat("diagonal", 35.);
}